

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::fill_M
          (Epnp *this,MatrixXd *M,int row,double *as,double u,double v)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  
  lVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar4 = 0;
  pdVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           row;
  do {
    *pdVar3 = as[lVar4] * this->fu;
    pdVar3[lVar2] = 0.0;
    pdVar3[lVar2 * 2] = (this->uc - u) * as[lVar4];
    pdVar3[1] = 0.0;
    pdVar3[lVar2 + 1] = as[lVar4] * this->fv;
    pdVar1 = as + lVar4;
    lVar4 = lVar4 + 1;
    pdVar3[lVar2 * 2 + 1] = (this->vc - v) * *pdVar1;
    pdVar3 = pdVar3 + lVar2 * 3;
  } while (lVar4 != 4);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::fill_M(
    Eigen::MatrixXd & M,
    const int row,
    const double * as,
    const double u,
    const double v)
{
  for(int i = 0; i < 4; i++)
  {
    M(row,3*i) = as[i] * fu;
    M(row,3*i+1) = 0.0;
    M(row,3*i+2) = as[i] * (uc - u);

    M(row+1,3*i) = 0.0;
    M(row+1,3*i+1) = as[i] * fv;
    M(row+1,3*i+2) = as[i] * (vc - v);
  }
}